

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

void Fl_Image::labeltype(Fl_Label *lo,int lx,int ly,int lw,int lh,Fl_Align la)

{
  Fl_Image *this;
  int iVar1;
  int local_38;
  uint local_34;
  int cy;
  int cx;
  Fl_Image *img;
  Fl_Align la_local;
  int lh_local;
  int lw_local;
  int ly_local;
  int lx_local;
  Fl_Label *lo_local;
  
  this = (Fl_Image *)lo->value;
  if ((la & 4) == 0) {
    if ((la & 8) == 0) {
      iVar1 = w(this);
      local_34 = (iVar1 - lw) / 2;
    }
    else {
      iVar1 = w(this);
      local_34 = iVar1 - lw;
    }
  }
  else {
    local_34 = 0;
  }
  if ((la & 1) == 0) {
    if ((la & 2) == 0) {
      iVar1 = h(this);
      local_38 = (iVar1 - lh) / 2;
    }
    else {
      local_38 = h(this);
      local_38 = local_38 - lh;
    }
  }
  else {
    local_38 = 0;
  }
  fl_color(lo->color);
  (*this->_vptr_Fl_Image[7])
            (this,(ulong)(uint)lx,(ulong)(uint)ly,(ulong)(uint)lw,(ulong)(uint)lh,(ulong)local_34,
             local_38);
  return;
}

Assistant:

void
Fl_Image::labeltype(const Fl_Label *lo,		// I - Label
                    int            lx,		// I - X position
		    int            ly,		// I - Y position
		    int            lw,		// I - Width of label
		    int            lh,		// I - Height of label
		    Fl_Align       la) {	// I - Alignment
  Fl_Image	*img;				// Image pointer
  int		cx, cy;				// Image position

  img = (Fl_Image *)(lo->value);

  if (la & FL_ALIGN_LEFT) cx = 0;
  else if (la & FL_ALIGN_RIGHT) cx = img->w() - lw;
  else cx = (img->w() - lw) / 2;

  if (la & FL_ALIGN_TOP) cy = 0;
  else if (la & FL_ALIGN_BOTTOM) cy = img->h() - lh;
  else cy = (img->h() - lh) / 2;

  fl_color((Fl_Color)lo->color);

  img->draw(lx, ly, lw, lh, cx, cy);
}